

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseBuilder::_newCommentNode(BaseBuilder *this,CommentNode **out,char *data,size_t size)

{
  int iVar1;
  Error EVar2;
  Error EVar3;
  Error extraout_EAX;
  undefined4 extraout_var;
  CommentNode *pCVar4;
  size_t local_20;
  
  *out = (CommentNode *)0x0;
  if (data != (char *)0x0) {
    if (size == 0xffffffffffffffff) {
      size = strlen(data);
    }
    if (size != 0) {
      iVar1 = Zone::dup(&this->_dataZone,(int)data);
      data = (char *)CONCAT44(extraout_var,iVar1);
      if (data == (char *)0x0) goto LAB_00112f24;
    }
  }
  if ((this->_allocator)._zone == (Zone *)0x0) {
    _newCommentNode();
    EVar3 = extraout_EAX;
LAB_00112f3a:
    EVar2 = EVar3;
    pCVar4 = (CommentNode *)0x0;
  }
  else {
    pCVar4 = (CommentNode *)ZoneAllocator::_alloc(&this->_allocator,0x30,&local_20);
    EVar2 = 0;
    EVar3 = 0;
    if (pCVar4 == (CommentNode *)0x0) goto LAB_00112f3a;
    (pCVar4->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
    (pCVar4->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
    (pCVar4->super_BaseNode).field_1._any._nodeType = '\t';
    (pCVar4->super_BaseNode).field_1._any._nodeFlags = (byte)this->_nodeFlags | 0x1c;
    (pCVar4->super_BaseNode)._passData = (void *)0x0;
    (pCVar4->super_BaseNode)._inlineComment = (char *)0x0;
    *(undefined8 *)((long)&(pCVar4->super_BaseNode).field_1 + 2) = 0;
    *(undefined8 *)((long)&(pCVar4->super_BaseNode).field_3 + 2) = 0;
    (pCVar4->super_BaseNode)._inlineComment = data;
  }
  *out = pCVar4;
  if (pCVar4 != (CommentNode *)0x0) {
    return EVar2;
  }
LAB_00112f24:
  EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  return EVar3;
}

Assistant:

Error BaseBuilder::_newCommentNode(CommentNode** out, const char* data, size_t size) {
  *out = nullptr;

  if (data) {
    if (size == SIZE_MAX)
      size = strlen(data);

    if (size > 0) {
      data = static_cast<char*>(_dataZone.dup(data, size, true));
      if (ASMJIT_UNLIKELY(!data))
        return reportError(DebugUtils::errored(kErrorOutOfMemory));
    }
  }

  return _newNodeT<CommentNode>(out, data);
}